

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

TextureBlendType getBlendType(QSpanData *data)

{
  TextureBlendType ft;
  QSpanData *data_local;
  
  if ((data->field_23).texture.type == Pattern) {
    ft = BlendTiled;
  }
  else if (*(short *)&data->field_0x88 >> 8 < 2) {
    ft = (TextureBlendType)((data->field_23).texture.type == Tiled);
  }
  else if ((data->bilinear & 1U) == 0) {
    if ((data->field_23).texture.type == Tiled) {
      ft = BlendTransformedTiled;
    }
    else {
      ft = BlendTransformed;
    }
  }
  else if ((data->field_23).texture.type == Tiled) {
    ft = BlendTransformedBilinearTiled;
  }
  else {
    ft = BlendTransformedBilinear;
  }
  return ft;
}

Assistant:

static TextureBlendType getBlendType(const QSpanData *data)
{
    TextureBlendType ft;
    if (data->texture.type == QTextureData::Pattern)
        ft = BlendTiled;
    else if (data->txop <= QTransform::TxTranslate)
        if (data->texture.type == QTextureData::Tiled)
            ft = BlendTiled;
        else
            ft = BlendUntransformed;
    else if (data->bilinear)
        if (data->texture.type == QTextureData::Tiled)
            ft = BlendTransformedBilinearTiled;
        else
            ft = BlendTransformedBilinear;
    else
        if (data->texture.type == QTextureData::Tiled)
            ft = BlendTransformedTiled;
        else
            ft = BlendTransformed;
    return ft;
}